

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_update_decoder.cpp
# Opt level: O0

PriceField __thiscall
bidfx_public_api::price::pixie::PriceUpdateDecoder::DecodeAsDouble
          (PriceUpdateDecoder *this,ByteBuffer *buffer,FieldDef *field_def)

{
  uint64_t uVar1;
  long value;
  anon_union_8_4_08ebdfac_for_PriceField_2 extraout_RDX;
  anon_union_8_4_08ebdfac_for_PriceField_2 extraout_RDX_00;
  anon_union_8_4_08ebdfac_for_PriceField_2 extraout_RDX_01;
  anon_union_8_4_08ebdfac_for_PriceField_2 extraout_RDX_02;
  anon_union_8_4_08ebdfac_for_PriceField_2 extraout_RDX_03;
  anon_union_8_4_08ebdfac_for_PriceField_2 aVar2;
  float fVar3;
  double dVar4;
  PriceField PVar5;
  FieldDef *field_def_local;
  ByteBuffer *buffer_local;
  
  switch(field_def->encoding_) {
  case FIXED4:
    fVar3 = tools::ByteBuffer::ReadFloat(buffer);
    PriceField::PriceField((PriceField *)this,(double)fVar3);
    aVar2 = extraout_RDX;
    break;
  default:
    SkipFieldValue(buffer,field_def);
    PriceField::PriceField((PriceField *)this);
    aVar2 = extraout_RDX_03;
    break;
  case FIXED8:
    dVar4 = tools::ByteBuffer::ReadDouble(buffer);
    PriceField::PriceField((PriceField *)this,dVar4);
    aVar2 = extraout_RDX_00;
    break;
  case VARINT:
    uVar1 = tools::Varint::ReadU64(&buffer->super_InputStream);
    dVar4 = EncodingUtil::DecodeDecimal(uVar1,field_def->scale_);
    PriceField::PriceField((PriceField *)this,dVar4);
    aVar2 = extraout_RDX_01;
    break;
  case ZIGZAG:
    uVar1 = tools::Varint::ReadU64(&buffer->super_InputStream);
    value = tools::Varint::ZigzagToLong(uVar1);
    dVar4 = EncodingUtil::DecodeDecimal(value,field_def->scale_);
    PriceField::PriceField((PriceField *)this,dVar4);
    aVar2 = extraout_RDX_02;
  }
  PVar5.field_1.long_value_ = aVar2.long_value_;
  PVar5._0_8_ = this;
  return PVar5;
}

Assistant:

PriceField PriceUpdateDecoder::DecodeAsDouble(ByteBuffer& buffer, FieldDef& field_def)
{
    switch(field_def.encoding_)
    {
        case FIXED4:
            return PriceField((double) buffer.ReadFloat());
        case FIXED8:
            return PriceField(buffer.ReadDouble());
        case VARINT:
            return PriceField(EncodingUtil::DecodeDecimal(Varint::ReadU64(buffer), field_def.scale_));
        case ZIGZAG:
            return PriceField(EncodingUtil::DecodeDecimal(Varint::ZigzagToLong(Varint::ReadU64(buffer)), field_def.scale_));
    }
    SkipFieldValue(buffer, field_def);
    return PriceField();
}